

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

EffectAnalyzer * __thiscall wasm::Pusher::getPushableEffects(Pusher *this,LocalSet *pushable)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::__detail::_Node_iterator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false,_false>,_bool>
  pVar3;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false> local_28;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false> local_20;
  iterator iter;
  LocalSet *pushable_local;
  Pusher *this_local;
  
  iter.super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false>)
           (_Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false>)
           pushable;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalSet_*,_wasm::EffectAnalyzer,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>_>_>
       ::find(&this->pushableEffects,(key_type *)&iter);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalSet_*,_wasm::EffectAnalyzer,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>_>_>
       ::end(&this->pushableEffects);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (bVar1) {
    pVar3 = std::
            unordered_map<wasm::LocalSet*,wasm::EffectAnalyzer,std::hash<wasm::LocalSet*>,std::equal_to<wasm::LocalSet*>,std::allocator<std::pair<wasm::LocalSet*const,wasm::EffectAnalyzer>>>
            ::try_emplace<wasm::PassOptions&,wasm::Module&,wasm::LocalSet*&>
                      ((unordered_map<wasm::LocalSet*,wasm::EffectAnalyzer,std::hash<wasm::LocalSet*>,std::equal_to<wasm::LocalSet*>,std::allocator<std::pair<wasm::LocalSet*const,wasm::EffectAnalyzer>>>
                        *)&this->pushableEffects,(key_type *)&iter,this->passOptions,this->module,
                       (LocalSet **)&iter);
    local_20._M_cur =
         (__node_type *)
         pVar3.first.
         super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false>.
         _M_cur;
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false,_false>::
           operator->((_Node_iterator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false,_false>
                       *)&local_20);
  return &ppVar2->second;
}

Assistant:

const EffectAnalyzer& getPushableEffects(LocalSet* pushable) {
    auto iter = pushableEffects.find(pushable);
    if (iter == pushableEffects.end()) {
      iter =
        pushableEffects.try_emplace(pushable, passOptions, module, pushable)
          .first;
    }
    return iter->second;
  }